

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar6;
  bool bVar7;
  uint uVar8;
  double *pdVar9;
  uint uVar10;
  Fad<double> *pFVar11;
  ulong uVar12;
  value_type vVar13;
  
  pFVar11 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  uVar8 = (pFVar11->dx_).num_elts;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  uVar1 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  pFVar6 = (pFVar3->fadexpr_).right_;
  uVar1 = (((pFVar6->fadexpr_).left_)->dx_).num_elts;
  uVar10 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar10 < (int)uVar1) {
    uVar10 = uVar1;
  }
  if ((int)uVar10 < (int)uVar2) {
    uVar10 = uVar2;
  }
  if ((int)uVar10 < (int)uVar8) {
    uVar10 = uVar8;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar10 == uVar1) {
    if (uVar10 == 0) goto LAB_013d799a;
    pdVar9 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar10 == 0) {
      if (uVar1 != 0) {
        pdVar9 = (this->dx_).ptr_to_data;
        if (pdVar9 != (double *)0x0) {
          operator_delete__(pdVar9);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_013d799a;
    }
    if (uVar1 != 0) {
      pdVar9 = (this->dx_).ptr_to_data;
      if (pdVar9 != (double *)0x0) {
        operator_delete__(pdVar9);
        pFVar11 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar10;
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar10) {
      uVar12 = (ulong)uVar10 << 3;
    }
    pdVar9 = (double *)operator_new__(uVar12);
    (this->dx_).ptr_to_data = pdVar9;
    uVar8 = (pFVar11->dx_).num_elts;
  }
  if ((uVar8 == 0) ||
     (bVar7 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
              ::hasFastAccess(&((fadexpr->fadexpr_).right_)->fadexpr_), !bVar7)) {
    if (0 < (int)uVar10) {
      uVar12 = 0;
      do {
        vVar13 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar12);
        pdVar9[uVar12] = vVar13;
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
    }
  }
  else if (0 < (int)uVar10) {
    uVar12 = 0;
    do {
      vVar13 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar12);
      pdVar9[uVar12] = vVar13;
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
LAB_013d799a:
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar6 = (pFVar3->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  this->val_ = (((pFVar6->fadexpr_).left_)->val_ * ((pFVar6->fadexpr_).right_)->val_ +
               (((pFVar5->fadexpr_).left_)->val_ - ((pFVar5->fadexpr_).right_)->val_) *
               ((pFVar4->fadexpr_).right_)->val_) * ((fadexpr->fadexpr_).left_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}